

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_IHDR(ucvector *out,uint w,uint h,LodePNGColorType colortype,uint bitdepth,
                  uint interlace_method)

{
  uint uVar1;
  uchar *in_RAX;
  uchar *chunk;
  uchar *local_38;
  
  local_38 = in_RAX;
  uVar1 = lodepng_chunk_init(&local_38,out,0xd,"IHDR");
  if (uVar1 == 0) {
    local_38[8] = (uchar)(w >> 0x18);
    local_38[9] = (uchar)(w >> 0x10);
    local_38[10] = (uchar)(w >> 8);
    local_38[0xb] = (uchar)w;
    local_38[0xc] = (uchar)(h >> 0x18);
    local_38[0xd] = (uchar)(h >> 0x10);
    local_38[0xe] = (uchar)(h >> 8);
    local_38[0xf] = (uchar)h;
    local_38[0x10] = (uchar)bitdepth;
    local_38[0x11] = (uchar)colortype;
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_38[0x14] = (uchar)interlace_method;
    lodepng_chunk_generate_crc(local_38);
  }
  return uVar1;
}

Assistant:

static unsigned addChunk_IHDR(ucvector* out, unsigned w, unsigned h,
                              LodePNGColorType colortype, unsigned bitdepth, unsigned interlace_method) {
  unsigned char *chunk, *data;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 13, "IHDR"));
  data = chunk + 8;

  lodepng_set32bitInt(data + 0, w); /*width*/
  lodepng_set32bitInt(data + 4, h); /*height*/
  data[8] = (unsigned char)bitdepth; /*bit depth*/
  data[9] = (unsigned char)colortype; /*color type*/
  data[10] = 0; /*compression method*/
  data[11] = 0; /*filter method*/
  data[12] = interlace_method; /*interlace method*/

  lodepng_chunk_generate_crc(chunk);
  return 0;
}